

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

void __thiscall Matrix2f::setCol(Matrix2f *this,int j,Vector2f *v)

{
  Vector2f *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar1;
  int colStart;
  
  fVar1 = Vector2f::x(in_RDX);
  *(float *)(in_RDI + (long)(in_ESI * 2) * 4) = fVar1;
  fVar1 = Vector2f::y(in_RDX);
  *(float *)(in_RDI + (long)(in_ESI * 2 + 1) * 4) = fVar1;
  return;
}

Assistant:

void Matrix2f::setCol( int j, const Vector2f& v )
{
	int colStart = 2 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
}